

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::~ScopedPrematureExitFile(ScopedPrematureExitFile *this)

{
  ulong uVar1;
  char *__filename;
  ostream *poVar2;
  GTestLog local_18;
  int local_14;
  ScopedPrematureExitFile *pSStack_10;
  int retval;
  ScopedPrematureExitFile *this_local;
  
  pSStack_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    local_14 = remove(__filename);
    if (local_14 != 0) {
      GTestLog::GTestLog(&local_18,GTEST_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/build_O0/_deps/gtest-src/googletest/src/gtest.cc"
                         ,0x141f);
      poVar2 = GTestLog::GetStream(&local_18);
      poVar2 = std::operator<<(poVar2,"Failed to remove premature exit filepath \"");
      poVar2 = std::operator<<(poVar2,(string *)this);
      poVar2 = std::operator<<(poVar2,"\" with error ");
      std::ostream::operator<<(poVar2,local_14);
      GTestLog::~GTestLog(&local_18);
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~ScopedPrematureExitFile() {
#ifndef GTEST_OS_ESP8266
    if (!premature_exit_filepath_.empty()) {
      int retval = remove(premature_exit_filepath_.c_str());
      if (retval) {
        GTEST_LOG_(ERROR) << "Failed to remove premature exit filepath \""
                          << premature_exit_filepath_ << "\" with error "
                          << retval;
      }
    }
#endif
  }